

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_GenFsmCond(Vec_Str_t *vCond,int nPis,int Prob)

{
  uint uVar1;
  byte Entry;
  bool bVar2;
  
  vCond->nSize = 0;
  if (nPis < 1) {
    nPis = 0;
  }
  while (bVar2 = nPis != 0, nPis = nPis + -1, bVar2) {
    uVar1 = Aig_ManRandom(0);
    Entry = 0x2d;
    if ((int)uVar1 % 100 <= Prob) {
      Entry = (byte)uVar1 & 1 | 0x30;
    }
    Vec_StrPush(vCond,Entry);
  }
  Vec_StrPush(vCond,'\0');
  return;
}

Assistant:

void Abc_GenFsmCond( Vec_Str_t * vCond, int nPis, int Prob )
{
    int i, Rand;
    Vec_StrClear( vCond );
    for ( i = 0; i < nPis; i++ )
    {
        Rand = Aig_ManRandom( 0 );
        if ( Rand % 100 > Prob )
            Vec_StrPush( vCond, '-' );
        else if ( Rand & 1 )
            Vec_StrPush( vCond, '1' );
        else
            Vec_StrPush( vCond, '0' );
    }
    Vec_StrPush( vCond, '\0' );
}